

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTestListener.cpp
# Opt level: O2

void __thiscall
rc::detail::LogTestListener::onShrinkTried
          (LogTestListener *this,CaseDescription *param_1,bool accepted)

{
  char *pcVar1;
  
  if (this->m_verboseShrinking == true) {
    pcVar1 = ".";
    if (accepted) {
      pcVar1 = "!";
    }
    std::operator<<(this->m_out,pcVar1);
    return;
  }
  return;
}

Assistant:

void LogTestListener::onShrinkTried(const CaseDescription &/*shrink*/,
                                    bool accepted) {
  if (!m_verboseShrinking) {
    return;
  }

  if (accepted) {
    m_out << "!";
  } else {
    m_out << ".";
  }
}